

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

void * xmlHashQLookup3(xmlHashTablePtr table,xmlChar *prefix,xmlChar *name,xmlChar *prefix2,
                      xmlChar *name2,xmlChar *prefix3,xmlChar *name3)

{
  int iVar1;
  byte *pbVar2;
  ulong uVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  _xmlHashEntry *p_Var6;
  
  if (name != (xmlChar *)0x0 && table != (xmlHashTablePtr)0x0) {
    pbVar2 = prefix;
    if (prefix == (xmlChar *)0x0) {
      pbVar2 = name;
    }
    uVar3 = (ulong)*pbVar2 * 0x1e + (long)table->random_seed;
    pxVar4 = name;
    pxVar5 = prefix;
    if (prefix != (xmlChar *)0x0) {
      for (; (long)(char)*pxVar5 != 0; pxVar5 = pxVar5 + 1) {
        uVar3 = uVar3 ^ (uVar3 >> 3) + uVar3 * 0x20 + (long)(char)*pxVar5;
      }
      uVar3 = uVar3 ^ uVar3 * 0x20 + (uVar3 >> 3) + 0x3a;
    }
    for (; (long)(char)*pxVar4 != 0; pxVar4 = pxVar4 + 1) {
      uVar3 = uVar3 ^ (uVar3 >> 3) + uVar3 * 0x20 + (long)(char)*pxVar4;
    }
    uVar3 = (uVar3 >> 3) + uVar3 * 0x20 ^ uVar3;
    pxVar4 = prefix2;
    if (prefix2 != (xmlChar *)0x0) {
      for (; (long)(char)*pxVar4 != 0; pxVar4 = pxVar4 + 1) {
        uVar3 = uVar3 ^ (uVar3 >> 3) + uVar3 * 0x20 + (long)(char)*pxVar4;
      }
      uVar3 = uVar3 ^ uVar3 * 0x20 + (uVar3 >> 3) + 0x3a;
    }
    pxVar4 = name2;
    if (name2 != (xmlChar *)0x0) {
      for (; (long)(char)*pxVar4 != 0; pxVar4 = pxVar4 + 1) {
        uVar3 = uVar3 ^ (uVar3 >> 3) + uVar3 * 0x20 + (long)(char)*pxVar4;
      }
    }
    uVar3 = (uVar3 >> 3) + uVar3 * 0x20 ^ uVar3;
    pxVar4 = prefix3;
    if (prefix3 != (xmlChar *)0x0) {
      for (; (long)(char)*pxVar4 != 0; pxVar4 = pxVar4 + 1) {
        uVar3 = uVar3 ^ (uVar3 >> 3) + uVar3 * 0x20 + (long)(char)*pxVar4;
      }
      uVar3 = uVar3 ^ uVar3 * 0x20 + (uVar3 >> 3) + 0x3a;
    }
    pxVar4 = name3;
    if (name3 != (xmlChar *)0x0) {
      for (; (long)(char)*pxVar4 != 0; pxVar4 = pxVar4 + 1) {
        uVar3 = uVar3 ^ (uVar3 >> 3) + uVar3 * 0x20 + (long)(char)*pxVar4;
      }
    }
    uVar3 = uVar3 % (ulong)(long)table->size;
    if (table->table[uVar3].valid != 0) {
      for (p_Var6 = table->table + uVar3; p_Var6 != (_xmlHashEntry *)0x0; p_Var6 = p_Var6->next) {
        iVar1 = xmlStrQEqual(prefix,name,p_Var6->name);
        if (((iVar1 != 0) && (iVar1 = xmlStrQEqual(prefix2,name2,p_Var6->name2), iVar1 != 0)) &&
           (iVar1 = xmlStrQEqual(prefix3,name3,p_Var6->name3), iVar1 != 0)) {
          return p_Var6->payload;
        }
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void *
xmlHashQLookup3(xmlHashTablePtr table,
                const xmlChar *prefix, const xmlChar *name,
		const xmlChar *prefix2, const xmlChar *name2,
		const xmlChar *prefix3, const xmlChar *name3) {
    unsigned long key;
    xmlHashEntryPtr entry;

    if (table == NULL)
	return(NULL);
    if (name == NULL)
	return(NULL);
    key = xmlHashComputeQKey(table, prefix, name, prefix2,
                             name2, prefix3, name3);
    if (table->table[key].valid == 0)
	return(NULL);
    for (entry = &(table->table[key]); entry != NULL; entry = entry->next) {
	if ((xmlStrQEqual(prefix, name, entry->name)) &&
	    (xmlStrQEqual(prefix2, name2, entry->name2)) &&
	    (xmlStrQEqual(prefix3, name3, entry->name3)))
	    return(entry->payload);
    }
    return(NULL);
}